

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# heap.hpp
# Opt level: O1

iterator __thiscall
first_fit_heap<16UL>::free_list_container::insert_after
          (free_list_container *this,header_free *val,iterator other)

{
  byte *pbVar1;
  int iVar2;
  ulong uVar3;
  undefined4 extraout_var;
  header_used *phVar4;
  undefined8 *puVar5;
  
  if (val == (header_free *)0x0) {
    val = (header_free *)0x0;
  }
  else {
    if (val <= other.block) {
LAB_0010311e:
      puVar5 = (undefined8 *)__cxa_allocate_exception(8);
      *puVar5 = &__cxxabiv1::__si_class_type_info::vtable;
      __cxa_throw(puVar5,&std::exception::typeinfo,std::exception::~exception);
    }
    if (other.block == (header_free *)0x0) {
      val->next_ = this->list;
      uVar3 = (val->super_header_used).raw;
      (val->super_header_used).raw = uVar3 | 0x4000000000000000;
      uVar3 = uVar3 & 0x3fffffffffffffff;
      *(ulong *)((long)&(val->super_header_used).canary + uVar3) = uVar3;
      this->list = val;
    }
    else {
      val->next_ = (other.block)->next_;
      uVar3 = (val->super_header_used).raw;
      (val->super_header_used).raw = uVar3 | 0x4000000000000000;
      uVar3 = uVar3 & 0x3fffffffffffffff;
      *(ulong *)((long)&(val->super_header_used).canary + uVar3) = uVar3;
      if (other.block == val) goto LAB_0010311e;
      (other.block)->next_ = val;
    }
    uVar3 = (val->super_header_used).raw & 0x3fffffffffffffff;
    iVar2 = (*this->mem->_vptr_memory[4])();
    phVar4 = header_used::preceding_block(&val->super_header_used,this->mem);
    if ((long)&val->next_ + uVar3 < CONCAT44(extraout_var,iVar2)) {
      pbVar1 = (byte *)((long)&val->next_ + uVar3 + 7);
      *pbVar1 = *pbVar1 | 0x80;
    }
    if ((phVar4 != (header_used *)0x0) && ((phVar4->raw & 0x4000000000000000) != 0)) {
      pbVar1 = (byte *)((long)&(val->super_header_used).raw + 7);
      *pbVar1 = *pbVar1 | 0x80;
    }
  }
  return (iterator)val;
}

Assistant:

iterator insert_after(header_free *val, iterator other)
        {
            if (not val) {
                return {};
            }

            ASSERT_HEAP(val > *other);

            if (other == end()) {
                // insert at list head
                val->next(list);
                val->is_free(true);
                val->update_footer();
                list = val;
            } else {
                // insert block into chain
                auto *tmp = (*other)->next();
                val->next(tmp);
                val->is_free(true);
                val->update_footer();

                ASSERT_HEAP(val != *other);
                (*other)->next(val);
            }

            // update meta data of surrounding blocks
            auto       *following = val->following_block(mem);
            const auto *preceding = val->preceding_block(mem);

            if (following) {
                following->prev_free(true);
            }

            if (preceding and preceding->is_free()) {
                val->prev_free(true);
            }

            return {val};
        }